

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O0

exr_result_t exr_attr_list_compute_size(exr_context_t ctxt,exr_attribute_list_t *list,uint64_t *out)

{
  long lVar1;
  int32_t *sz_00;
  exr_result_t eVar2;
  long *in_RDX;
  int *in_RSI;
  exr_context_t in_RDI;
  int32_t sz;
  int s;
  int c;
  exr_attribute_t *cur;
  int i;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  uint64_t retval;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar3;
  exr_result_t local_2c;
  long local_28;
  exr_result_t local_4;
  
  local_28 = 0;
  local_2c = 0;
  if (in_RDI == (exr_context_t)0x0) {
    local_4 = 2;
  }
  else if (in_RSI == (int *)0x0) {
    local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Missing list to compute size");
  }
  else if (in_RDX == (long *)0x0) {
    local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Expected output pointer");
  }
  else {
    *in_RDX = 0;
    for (iVar3 = 0; iVar3 < *in_RSI; iVar3 = iVar3 + 1) {
      sz_00 = *(int32_t **)(*(long *)(in_RSI + 2) + (long)iVar3 * 8);
      lVar1 = (ulong)*(byte *)((long)sz_00 + 0x11) + (ulong)*(byte *)(sz_00 + 4) + local_28;
      local_28 = lVar1 + 6;
      switch(sz_00[5]) {
      case 0:
      case 0x1e:
      default:
        eVar2 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,3,
                           "Invalid / unhandled type \'%s\' for attribute \'%s\', unable to compute size"
                           ,*(undefined8 *)(sz_00 + 2),*(undefined8 *)sz_00);
        return eVar2;
      case 1:
        local_28 = lVar1 + 0x16;
        break;
      case 2:
        local_28 = lVar1 + 0x16;
        break;
      case 3:
        for (in_stack_ffffffffffffffb4 = 0; in_stack_ffffffffffffffb4 < **(int **)(sz_00 + 6);
            in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
          local_28 = *(int *)(*(long *)(*(long *)(sz_00 + 6) + 8) +
                             (long)in_stack_ffffffffffffffb4 * 0x20) + local_28 + 0x11;
        }
        break;
      case 4:
        local_28 = lVar1 + 0x26;
        break;
      case 5:
      case 7:
      case 0xc:
        local_28 = lVar1 + 7;
        break;
      case 6:
        local_28 = lVar1 + 0xe;
        break;
      case 8:
        local_28 = lVar1 + 10;
        break;
      case 9:
        local_28 = (long)**(int **)(sz_00 + 6) * 4 + local_28;
        break;
      case 10:
        local_28 = lVar1 + 10;
        break;
      case 0xb:
        local_28 = lVar1 + 0x22;
        break;
      case 0xd:
        local_28 = lVar1 + 0x2a;
        break;
      case 0xe:
        local_28 = lVar1 + 0x4e;
        break;
      case 0xf:
        local_28 = lVar1 + 0x46;
        break;
      case 0x10:
        local_28 = lVar1 + 0x86;
        break;
      case 0x11:
        local_28 = (ulong)**(uint **)(sz_00 + 6) * (ulong)*(uint *)(*(long *)(sz_00 + 6) + 4) * 4 +
                   local_28;
        break;
      case 0x12:
        local_28 = lVar1 + 0xe;
        break;
      case 0x13:
        local_28 = **(int **)(sz_00 + 6) + local_28;
        break;
      case 0x14:
        for (in_stack_ffffffffffffffb0 = 0; in_stack_ffffffffffffffb0 < **(int **)(sz_00 + 6);
            in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 + 1) {
          local_28 = *(int *)(*(long *)(*(long *)(sz_00 + 6) + 8) +
                             (long)in_stack_ffffffffffffffb0 * 0x10) + local_28 + 4;
        }
        break;
      case 0x15:
        local_28 = lVar1 + 0xf;
        break;
      case 0x16:
        local_28 = lVar1 + 0xe;
        break;
      case 0x17:
        local_28 = lVar1 + 0xe;
        break;
      case 0x18:
        local_28 = lVar1 + 0xe;
        break;
      case 0x19:
        local_28 = lVar1 + 0x16;
        break;
      case 0x1a:
        local_28 = lVar1 + 0x12;
        break;
      case 0x1b:
        local_28 = lVar1 + 0x12;
        break;
      case 0x1c:
        local_28 = lVar1 + 0x1e;
        break;
      case 0x1d:
        if (*(long *)(*(long *)(sz_00 + 6) + 0x10) == 0) {
          if ((*(long *)(*(long *)(sz_00 + 6) + 0x18) != 0) &&
             (local_2c = exr_attr_opaquedata_pack
                                   (in_RDI,(exr_attr_opaquedata_t *)
                                           CONCAT44(iVar3,in_stack_ffffffffffffffc0),sz_00,
                                    (void **)CONCAT44(in_stack_ffffffffffffffb4,
                                                      in_stack_ffffffffffffffb0)), local_2c != 0)) {
            return local_2c;
          }
        }
        else {
          local_28 = **(int **)(sz_00 + 6) + local_28;
        }
      }
    }
    *in_RDX = local_28;
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_list_compute_size (
    exr_context_t ctxt, exr_attribute_list_t* list, uint64_t* out)
{
    uint64_t     retval = 0;
    exr_result_t rv     = EXR_ERR_SUCCESS;

    INTERN_EXR_PROMOTE_CONST_CONTEXT_OR_ERROR (ctxt);

    if (!list)
        return pctxt->report_error (
            pctxt, EXR_ERR_INVALID_ARGUMENT, "Missing list to compute size");

    if (!out)
        return pctxt->report_error (
            pctxt, EXR_ERR_INVALID_ARGUMENT, "Expected output pointer");

    *out = 0;
    for (int i = 0; i < list->num_attributes; ++i)
    {
        const exr_attribute_t* cur = list->entries[i];
        retval += (size_t) cur->name_length + 1;
        retval += (size_t) cur->type_name_length + 1;
        retval += sizeof (int32_t);
        switch (cur->type)
        {
            case EXR_ATTR_BOX2I: retval += sizeof (*(cur->box2i)); break;
            case EXR_ATTR_BOX2F: retval += sizeof (*(cur->box2f)); break;
            case EXR_ATTR_CHLIST:
                for (int c = 0; c < cur->chlist->num_channels; ++c)
                {
                    retval += (size_t) cur->chlist->entries[c].name.length + 1;
                    retval += sizeof (int32_t) * 4;
                }
                break;
            case EXR_ATTR_CHROMATICITIES:
                retval += sizeof (*(cur->chromaticities));
                break;
            case EXR_ATTR_COMPRESSION:
            case EXR_ATTR_ENVMAP:
            case EXR_ATTR_LINEORDER: retval += sizeof (uint8_t); break;
            case EXR_ATTR_DOUBLE: retval += sizeof (double); break;
            case EXR_ATTR_FLOAT: retval += sizeof (float); break;
            case EXR_ATTR_FLOAT_VECTOR:
                retval += sizeof (float) * (size_t) (cur->floatvector->length);
                break;
            case EXR_ATTR_INT: retval += sizeof (int32_t); break;
            case EXR_ATTR_KEYCODE: retval += sizeof (*(cur->keycode)); break;
            case EXR_ATTR_M33F: retval += sizeof (*(cur->m33f)); break;
            case EXR_ATTR_M33D: retval += sizeof (*(cur->m33d)); break;
            case EXR_ATTR_M44F: retval += sizeof (*(cur->m44f)); break;
            case EXR_ATTR_M44D: retval += sizeof (*(cur->m44d)); break;
            case EXR_ATTR_PREVIEW:
                retval += (size_t) cur->preview->width *
                          (size_t) cur->preview->height * (size_t) 4;
                break;
            case EXR_ATTR_RATIONAL: retval += sizeof (*(cur->rational)); break;
            case EXR_ATTR_STRING: retval += (size_t) cur->string->length; break;
            case EXR_ATTR_STRING_VECTOR:
                for (int s = 0; s < cur->stringvector->n_strings; ++s)
                {
                    retval += (size_t) cur->stringvector->strings[s].length;
                    retval += sizeof (int32_t);
                }
                break;
            case EXR_ATTR_TILEDESC: retval += sizeof (*(cur->tiledesc)); break;
            case EXR_ATTR_TIMECODE: retval += sizeof (*(cur->timecode)); break;
            case EXR_ATTR_V2I: retval += sizeof (*(cur->v2i)); break;
            case EXR_ATTR_V2F: retval += sizeof (*(cur->v2f)); break;
            case EXR_ATTR_V2D: retval += sizeof (*(cur->v2d)); break;
            case EXR_ATTR_V3I: retval += sizeof (*(cur->v3i)); break;
            case EXR_ATTR_V3F: retval += sizeof (*(cur->v3f)); break;
            case EXR_ATTR_V3D: retval += sizeof (*(cur->v3d)); break;
            case EXR_ATTR_OPAQUE:
                if (cur->opaque->packed_data)
                    retval += (size_t) cur->opaque->size;
                else if (cur->opaque->unpacked_data)
                {
                    int32_t sz = 0;
                    rv =
                        exr_attr_opaquedata_pack (ctxt, cur->opaque, &sz, NULL);
                    if (rv != EXR_ERR_SUCCESS) return rv;

                    retval += (size_t) sz;
                }
                break;
            case EXR_ATTR_UNKNOWN:
            case EXR_ATTR_LAST_KNOWN_TYPE:
            default:
                return pctxt->print_error (
                    pctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Invalid / unhandled type '%s' for attribute '%s', unable to compute size",
                    cur->type_name,
                    cur->name);
        }
    }

    *out = retval;
    return rv;
}